

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O0

void idx2::Resize(volume *Vol,v3i *Dims3,dtype Type,allocator *Alloc)

{
  dtype dVar1;
  dtype OldType;
  allocator *Alloc_local;
  dtype Type_local;
  v3i *Dims3_local;
  volume *Vol_local;
  int local_24;
  
  dVar1 = Vol->Type;
  Vol->Type = Type;
  Resize(Vol,Dims3,Alloc);
  switch(Vol->Type) {
  case int8:
  case uint8:
    local_24 = 1;
    break;
  case int16:
  case uint16:
    local_24 = 2;
    break;
  case int32:
  case uint32:
  case float32:
    local_24 = 4;
    break;
  case int64:
  case uint64:
  case float64:
    local_24 = 8;
    break;
  default:
    local_24 = 0;
  }
  if ((Vol->Buffer).Bytes <
      (long)(Dims3->field_0).field_0.X * (long)(Dims3->field_0).field_0.Y *
      (long)(Dims3->field_0).field_0.Z * (long)local_24) {
    Vol->Type = dVar1;
  }
  return;
}

Assistant:

void
Resize(volume* Vol, const v3i& Dims3, dtype Type, allocator* Alloc)
{
  auto OldType = Vol->Type;
  Vol->Type = Type;
  Resize(Vol, Dims3, Alloc);
  if (Size(Vol->Buffer) < Prod<i64>(Dims3) * SizeOf(Vol->Type))
    Vol->Type = OldType;
}